

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OffsetTable.cpp
# Opt level: O2

JSONNode __thiscall ser::OffsetTable::TableToJSON(OffsetTable *this)

{
  long lVar1;
  _Rb_tree_node_base *p_Var2;
  uint uVar3;
  long *in_RSI;
  allocator local_91;
  internalJSONNode *local_90;
  JSONNode offsetsnode;
  JSONNode entrynode;
  JSONNode valueNode;
  JSONNode local_58;
  json_string local_50;
  
  ::JSONNode::JSONNode((JSONNode *)this,'\x04');
  std::__cxx11::string::string((string *)&local_50,"OffsetTable",(allocator *)&entrynode);
  local_90 = (internalJSONNode *)this;
  ::JSONNode::set_name((JSONNode *)this,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  uVar3 = 0;
  while( true ) {
    if ((ulong)((in_RSI[1] - *in_RSI) / 0x50) <= (ulong)uVar3) break;
    Savepoint::ToJSON((Savepoint *)&entrynode,(int)*in_RSI + uVar3 * 0x50);
    ::JSONNode::JSONNode(&offsetsnode,'\x05');
    std::__cxx11::string::string((string *)&local_50,"__offsets",(allocator *)&valueNode);
    ::JSONNode::set_name(&offsetsnode,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    lVar1 = in_RSI[3] + (ulong)uVar3 * 0x30;
    for (p_Var2 = *(_Rb_tree_node_base **)(lVar1 + 0x18);
        p_Var2 != (_Rb_tree_node_base *)(lVar1 + 8);
        p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
      ::JSONNode::JSONNode(&valueNode,'\x04');
      ::JSONNode::set_name(&valueNode,(json_string *)(p_Var2 + 1));
      std::__cxx11::string::string((string *)&local_50,"",&local_91);
      ::JSONNode::JSONNode(&local_58,&local_50,*(long *)(p_Var2 + 2));
      ::JSONNode::push_back(&valueNode,&local_58);
      ::JSONNode::~JSONNode(&local_58);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::string((string *)&local_50,"",&local_91);
      ::JSONNode::JSONNode(&local_58,&local_50,(json_string *)&p_Var2[2]._M_parent);
      ::JSONNode::push_back(&valueNode,&local_58);
      ::JSONNode::~JSONNode(&local_58);
      std::__cxx11::string::~string((string *)&local_50);
      ::JSONNode::push_back(&offsetsnode,&valueNode);
      ::JSONNode::~JSONNode(&valueNode);
    }
    ::JSONNode::push_back(&entrynode,&offsetsnode);
    ::JSONNode::push_back((JSONNode *)local_90,&entrynode);
    ::JSONNode::~JSONNode(&offsetsnode);
    ::JSONNode::~JSONNode(&entrynode);
    uVar3 = uVar3 + 1;
  }
  return (JSONNode)local_90;
}

Assistant:

JSONNode OffsetTable::TableToJSON() const
{
    JSONNode node(JSON_ARRAY);
    node.set_name("OffsetTable");
    for (unsigned savepointID = 0; savepointID < savepoints_.size(); ++savepointID)
    {
        JSONNode entrynode = savepoints_[savepointID].ToJSON(savepointID);
        JSONNode offsetsnode;
        offsetsnode.set_name("__offsets");

        const OffsetTableEntry& entry = entries_[savepointID];
        for (const_iterator iter = entry.begin(); iter != entry.end(); ++iter)
        {
            JSONNode valueNode(JSON_ARRAY);
            valueNode.set_name(iter->first);
            valueNode.push_back(JSONNode("", iter->second.offset));
            valueNode.push_back(JSONNode("", iter->second.checksum));
            offsetsnode.push_back(valueNode);
        }

        entrynode.push_back(offsetsnode);

        node.push_back(entrynode);
    }

    return node;
}